

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.hpp
# Opt level: O1

void __thiscall
Diligent::EngineFactoryBase<Diligent::IEngineFactoryVk>::
CreateDearchiver<Diligent::DearchiverVkImpl>
          (EngineFactoryBase<Diligent::IEngineFactoryVk> *this,DearchiverCreateInfo *CreateInfo,
          IDearchiver **ppDearchiver)

{
  DearchiverVkImpl *pObj;
  RefCntAutoPtr<Diligent::DearchiverVkImpl> pDearchiver;
  RefCntAutoPtr<Diligent::DearchiverVkImpl> local_48;
  IMemoryAllocator *local_40;
  undefined8 local_38;
  char *local_30;
  char *local_28;
  undefined4 local_20;
  
  if (ppDearchiver != (IDearchiver **)0x0) {
    *ppDearchiver = (IDearchiver *)0x0;
    local_40 = GetRawAllocator();
    local_38 = 0;
    local_30 = "Dearchiver instance";
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/EngineFactoryBase.hpp"
    ;
    local_20 = 0x86;
    pObj = MakeNewRCObj<Diligent::DearchiverVkImpl,Diligent::IMemoryAllocator>::operator()
                     ((MakeNewRCObj<Diligent::DearchiverVkImpl,Diligent::IMemoryAllocator> *)
                      &local_40,CreateInfo);
    RefCntAutoPtr<Diligent::DearchiverVkImpl>::RefCntAutoPtr(&local_48,pObj);
    if (local_48.m_pObject != (DearchiverVkImpl *)0x0) {
      (**((local_48.m_pObject)->super_DearchiverBase).super_ObjectBase<Diligent::IDearchiver>.
         super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject._vptr_IObject
      )(local_48.m_pObject,IID_Dearchiver,ppDearchiver);
    }
    if (local_48.m_pObject != (DearchiverVkImpl *)0x0) {
      (*((local_48.m_pObject)->super_DearchiverBase).super_ObjectBase<Diligent::IDearchiver>.
        super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject._vptr_IObject
        [2])();
    }
  }
  return;
}

Assistant:

void CreateDearchiver(const DearchiverCreateInfo& CreateInfo,
                          IDearchiver**               ppDearchiver) const
    {
        if (ppDearchiver == nullptr)
            return;

        *ppDearchiver = nullptr;
        RefCntAutoPtr<DearchiverImplType> pDearchiver{NEW_RC_OBJ(GetRawAllocator(), "Dearchiver instance", DearchiverImplType)(CreateInfo)};

        if (pDearchiver)
            pDearchiver->QueryInterface(IID_Dearchiver, reinterpret_cast<IObject**>(ppDearchiver));
    }